

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O2

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::
dispatch<false,TI::TMS::CharacterSequencer<(TI::TMS::Personality)3>>
          (Base<(TI::TMS::Personality)3> *this,CharacterSequencer<(TI::TMS::Personality)3> *fetcher,
          int start,int end)

{
  Base<(TI::TMS::Personality)3> *pBVar1;
  
  switch(start) {
  case 0:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<0>(fetcher);
  case 1:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<1>(fetcher);
  case 2:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<2>(fetcher);
  case 3:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<3>(fetcher);
  case 4:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<4>(fetcher);
  case 5:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<5>(fetcher);
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<15>(fetcher);
  case 0x10:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<16>(fetcher);
  case 0x11:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<17>(fetcher);
  case 0x12:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<18>(fetcher);
  case 0x13:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<19>(fetcher);
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ = (ushort)(pBVar1->ram_)._M_elems[(fetcher->character_fetcher).row_base];
  case 0x1c:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<28>(fetcher);
  case 0x1d:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<29>(fetcher);
  case 0x1e:
  case 0x1f:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 1];
  case 0x20:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<32>(fetcher);
  case 0x21:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<33>(fetcher);
  case 0x22:
  case 0x23:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 2];
  case 0x24:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<36>(fetcher);
  case 0x25:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<37>(fetcher);
  case 0x26:
  case 0x27:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 3];
  case 0x28:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<40>(fetcher);
  case 0x29:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<41>(fetcher);
  case 0x2a:
  case 0x2b:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 4];
  case 0x2c:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<44>(fetcher);
  case 0x2d:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<45>(fetcher);
  case 0x2e:
  case 0x2f:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 5];
  case 0x30:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<48>(fetcher);
  case 0x31:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<49>(fetcher);
  case 0x32:
  case 0x33:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 6];
  case 0x34:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<52>(fetcher);
  case 0x35:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<53>(fetcher);
  case 0x36:
  case 0x37:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 7];
  case 0x38:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<56>(fetcher);
  case 0x39:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<57>(fetcher);
  case 0x3a:
  case 0x3b:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 8];
  case 0x3c:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<60>(fetcher);
  case 0x3d:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<61>(fetcher);
  case 0x3e:
  case 0x3f:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 9];
  case 0x40:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<64>(fetcher);
  case 0x41:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<65>(fetcher);
  case 0x42:
  case 0x43:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 10];
  case 0x44:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<68>(fetcher);
  case 0x45:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<69>(fetcher);
  case 0x46:
  case 0x47:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xb];
  case 0x48:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<72>(fetcher);
  case 0x49:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<73>(fetcher);
  case 0x4a:
  case 0x4b:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xc];
  case 0x4c:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<76>(fetcher);
  case 0x4d:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<77>(fetcher);
  case 0x4e:
  case 0x4f:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xd];
  case 0x50:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<80>(fetcher);
  case 0x51:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<81>(fetcher);
  case 0x52:
  case 0x53:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xe];
  case 0x54:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<84>(fetcher);
  case 0x55:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<85>(fetcher);
  case 0x56:
  case 0x57:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xf];
  case 0x58:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<88>(fetcher);
  case 0x59:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<89>(fetcher);
  case 0x5a:
  case 0x5b:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x10];
  case 0x5c:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<92>(fetcher);
  case 0x5d:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<93>(fetcher);
  case 0x5e:
  case 0x5f:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x11];
  case 0x60:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<96>(fetcher);
  case 0x61:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<97>(fetcher);
  case 0x62:
  case 99:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x12];
  case 100:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<100>(fetcher);
  case 0x65:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<101>(fetcher);
  case 0x66:
  case 0x67:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x13];
  case 0x68:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<104>(fetcher);
  case 0x69:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<105>(fetcher);
  case 0x6a:
  case 0x6b:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x14];
  case 0x6c:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<108>(fetcher);
  case 0x6d:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<109>(fetcher);
  case 0x6e:
  case 0x6f:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x15];
  case 0x70:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<112>(fetcher);
  case 0x71:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<113>(fetcher);
  case 0x72:
  case 0x73:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x16];
  case 0x74:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<116>(fetcher);
  case 0x75:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<117>(fetcher);
  case 0x76:
  case 0x77:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x17];
  case 0x78:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<120>(fetcher);
  case 0x79:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<121>(fetcher);
  case 0x7a:
  case 0x7b:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x18];
  case 0x7c:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<124>(fetcher);
  case 0x7d:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<125>(fetcher);
  case 0x7e:
  case 0x7f:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x19];
  case 0x80:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<128>(fetcher);
  case 0x81:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<129>(fetcher);
  case 0x82:
  case 0x83:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1a];
  case 0x84:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<132>(fetcher);
  case 0x85:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<133>(fetcher);
  case 0x86:
  case 0x87:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1b];
  case 0x88:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<136>(fetcher);
  case 0x89:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<137>(fetcher);
  case 0x8a:
  case 0x8b:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1c];
  case 0x8c:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<140>(fetcher);
  case 0x8d:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<141>(fetcher);
  case 0x8e:
  case 0x8f:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1d];
  case 0x90:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<144>(fetcher);
  case 0x91:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<145>(fetcher);
  case 0x92:
  case 0x93:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1e];
  case 0x94:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<148>(fetcher);
  case 0x95:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<149>(fetcher);
  case 0x96:
  case 0x97:
    pBVar1 = (fetcher->character_fetcher).base;
    pBVar1->tile_offset_ =
         (ushort)(pBVar1->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1f];
  case 0x98:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<152>(fetcher);
  case 0x99:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<153>(fetcher);
  case 0x9a:
  case 0x9b:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<155>(fetcher);
  case 0x9c:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<156>(fetcher);
  case 0x9d:
    CharacterSequencer<(TI::TMS::Personality)3>::fetch<157>(fetcher);
    return;
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
    return;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Components/9918/Implementation/../Implementation/Fetch.hpp"
                  ,0x3b,
                  "void TI::TMS::Base<TI::TMS::SMSVDP>::dispatch(SequencerT &, int, int) [personality = TI::TMS::SMSVDP, use_end = false, Fetcher = TI::TMS::CharacterSequencer<TI::TMS::SMSVDP>]"
                 );
  }
}

Assistant:

void Base<personality>::dispatch(SequencerT &fetcher, int start, int end) {
#define index(n)						\
	if(use_end && end == n) return;		\
	[[fallthrough]];					\
	case n: fetcher.template fetch<from_internal<personality, Clock::FromStartOfSync>(n)>();

	switch(start) {
		default: assert(false);
		index(0);	index(1);	index(2);	index(3);	index(4);	index(5);	index(6);	index(7);	index(8);	index(9);
		index(10);	index(11);	index(12);	index(13);	index(14);	index(15);	index(16);	index(17);	index(18);	index(19);
		index(20);	index(21);	index(22);	index(23);	index(24);	index(25);	index(26);	index(27);	index(28);	index(29);
		index(30);	index(31);	index(32);	index(33);	index(34);	index(35);	index(36);	index(37);	index(38);	index(39);
		index(40);	index(41);	index(42);	index(43);	index(44);	index(45);	index(46);	index(47);	index(48);	index(49);
		index(50);	index(51);	index(52);	index(53);	index(54);	index(55);	index(56);	index(57);	index(58);	index(59);
		index(60);	index(61);	index(62);	index(63);	index(64);	index(65);	index(66);	index(67);	index(68);	index(69);
		index(70);	index(71);	index(72);	index(73);	index(74);	index(75);	index(76);	index(77);	index(78);	index(79);
		index(80);	index(81);	index(82);	index(83);	index(84);	index(85);	index(86);	index(87);	index(88);	index(89);
		index(90);	index(91);	index(92);	index(93);	index(94);	index(95);	index(96);	index(97);	index(98);	index(99);
		index(100);	index(101);	index(102);	index(103);	index(104);	index(105);	index(106);	index(107);	index(108);	index(109);
		index(110);	index(111);	index(112);	index(113);	index(114);	index(115);	index(116);	index(117);	index(118);	index(119);
		index(120);	index(121);	index(122);	index(123);	index(124);	index(125);	index(126);	index(127);	index(128);	index(129);
		index(130);	index(131);	index(132);	index(133);	index(134);	index(135);	index(136);	index(137);	index(138);	index(139);
		index(140);	index(141);	index(142);	index(143);	index(144);	index(145);	index(146);	index(147);	index(148);	index(149);
		index(150);	index(151);	index(152);	index(153);	index(154);	index(155);	index(156);	index(157);	index(158);	index(159);
		index(160);	index(161);	index(162);	index(163);	index(164);	index(165);	index(166);	index(167);	index(168);	index(169);
		index(170);
	}

#undef index
}